

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O1

void __thiscall dlib::logger::logger(logger *this,string *name_)

{
  string *name;
  binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>
  *this_00;
  unsigned_long *puVar1;
  char cVar2;
  pointer pcVar3;
  node *pnVar4;
  bool bVar5;
  global_data *pgVar6;
  streambuf *psVar7;
  node *pnVar8;
  print_header_type p_Var9;
  logger *temp;
  auto_mutex M;
  logger *local_98;
  auto_mutex local_90;
  mfp_kernel_1_base_class<4UL> local_78;
  
  this->_vptr_logger = (_func_int **)&PTR__logger_0031aaf8;
  pgVar6 = get_global_data();
  this->gd = pgVar6;
  name = &this->logger_name;
  (this->logger_name)._M_dataplus._M_p = (pointer)&(this->logger_name).field_2;
  pcVar3 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)name,pcVar3,pcVar3 + name_->_M_string_length);
  psVar7 = global_data::output_streambuf(this->gd,name);
  std::ostream::ostream(&this->out,psVar7);
  global_data::level(&this->cur_level,this->gd,name);
  (this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.data = &this->hook;
  *(undefined8 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 8) = 0;
  *(undefined4 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 0x10) = 2;
  *(undefined8 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 0x18) = 0;
  *(undefined8 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 0x20) = 0;
  (this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem.void_ptr =
       &PTR__mp_base_base_0031ab28;
  local_90.r = &this->gd->m;
  local_90.m = (mutex *)0x0;
  local_90.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_90.r,1);
  pgVar6 = this->gd;
  this_00 = &(pgVar6->loggers).bst;
  local_98 = this;
  if ((pgVar6->loggers).bst.tree_size == 0) {
    pnVar8 = (node *)operator_new(0x28);
    (pgVar6->loggers).bst.tree_root = pnVar8;
    pnVar8->color = '\x01';
    pnVar4 = (pgVar6->loggers).bst.NIL;
    pnVar8->left = pnVar4;
    pnVar8->right = pnVar4;
    pnVar8->parent = pnVar4;
    local_98 = pnVar8->d;
    pnVar8->d = this;
    pnVar4 = (pgVar6->loggers).bst.tree_root;
    cVar2 = pnVar4->r;
    pnVar4->r = (pgVar6->loggers).junk;
    (pgVar6->loggers).junk = cVar2;
  }
  else {
    binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>
    ::add_to_tree(this_00,(pgVar6->loggers).bst.tree_root,&local_98,&(pgVar6->loggers).junk);
  }
  puVar1 = &(pgVar6->loggers).bst.tree_size;
  *puVar1 = *puVar1 + 1;
  (*(pgVar6->loggers).bst.super_enumerable<dlib::map_pair<dlib::logger_*,_char>_>._vptr_enumerable
    [3])(this_00);
  p_Var9 = global_data::logger_header(this->gd,name);
  this->print_header = p_Var9;
  bVar5 = global_data::auto_flush(this->gd,name);
  this->auto_flush_enabled = bVar5;
  global_data::output_hook((hook_mfp *)&local_78,this->gd,name);
  mfp_kernel_1_base_class<4UL>::operator=
            (&(this->hook).super_mfp_kernel_1_base_class<4UL>,&local_78);
  (*(code *)**local_78.mp_memory.data)();
  auto_mutex::unlock(&local_90);
  return;
}

Assistant:

logger::
    logger (  
        const std::string& name_
    ) : 
        gd(get_global_data()),
        logger_name(name_),
        out(gd.output_streambuf(logger_name)),
        cur_level(gd.level(logger_name))
    {
        DLIB_ASSERT(name_[0] != '\0',
                    "\tlogger::logger()"
                    << "\n\tYou can't make a logger with an empty name"
                    << "\n\tthis: " << this
        );

        auto_mutex M(gd.m);
        logger* temp = this;
        gd.loggers.add(temp);

        // load the appropriate settings
        print_header        = gd.logger_header(logger_name);
        auto_flush_enabled  = gd.auto_flush(logger_name);
        hook                = gd.output_hook(logger_name);
    }